

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

int qRegisterNormalizedMetaType_QSslCertificate(QByteArray *name)

{
  int iVar1;
  QByteArray *in_stack_00000010;
  
  iVar1 = qRegisterNormalizedMetaTypeImplementation<QSslCertificate>(in_stack_00000010);
  return iVar1;
}

Assistant:

QSslCertificatePrivate::QSslCertificatePrivate()
{
#ifndef QT_NO_SSL
    QSslSocketPrivate::ensureInitialized();
#endif

    const QTlsBackend *tlsBackend = QTlsBackend::activeOrAnyBackend();
    if (tlsBackend)
        backend.reset(tlsBackend->createCertificate());
    else
        qCWarning(lcSsl, "No TLS backend is available");
}